

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_uo_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong local_58;
  
  if (len < 0x41) {
    uVar5 = farmhash64_na(s,len);
    lVar9 = -0x622015f714c7d297;
    uVar7 = (uVar5 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar7 = (uVar7 >> 0x2f ^ seed1 ^ uVar7) * -0x622015f714c7d297;
    uVar7 = uVar7 >> 0x2f ^ uVar7;
  }
  else {
    uVar15 = 0;
    lVar17 = seed0 * -0x651e95c4d06fbfb1;
    lVar14 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar7 = (ulong)(lVar14 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar14 * -0x651e95c4d06fbfb1;
    local_58 = uVar7 * -0x651e95c4d06fbfb1;
    lVar22 = seed0 + uVar7 * 0x651e95c4d06fbfb1;
    lVar9 = 0;
    lVar6 = (ulong)((uint)lVar22 & 0x82) + 0x9ae16a3b2f90404f;
    uVar7 = (ulong)((uint)(len - 1) & 0x3f);
    plVar8 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar4 = *(long *)((long)s + 0x30);
      lVar19 = *(long *)((long)s + 8);
      uVar11 = (local_58 + *plVar1) * lVar6;
      lVar13 = uVar15 + *(long *)((long)s + 0x38);
      uVar15 = lVar14 + *(long *)((long)s + 0x10);
      uVar18 = lVar17 + *(long *)s + lVar19;
      lVar14 = lVar22 + *(long *)((long)s + 0x38);
      lVar12 = (uVar11 >> 0x20 | uVar11 << 0x20) + lVar13;
      lVar22 = *(long *)s + lVar4 + lVar12 * 9;
      plVar2 = (long *)((long)s + 0x20);
      uVar11 = seed0 + *plVar2;
      lVar21 = (uVar11 >> 0x21 | uVar11 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar3 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      uVar11 = seed1 + lVar19 + *plVar3;
      local_58 = uVar15 >> 0x1d | uVar15 << 0x23;
      lVar14 = lVar14 + lVar21;
      uVar15 = (uVar18 >> 0x1a | uVar18 << 0x26) * 9;
      lVar19 = uVar15 + lVar19;
      lVar17 = lVar19 - lVar14;
      uVar18 = lVar4 + *plVar3 + lVar13 + lVar12 + lVar17;
      seed0 = lVar21 + lVar17;
      lVar9 = (lVar9 + lVar4 ^ uVar15) * 9 + *plVar2;
      lVar17 = lVar19 + uVar18;
      uVar15 = uVar18 >> 0x22 | uVar18 * 0x40000000;
      seed1 = (uVar11 >> 0x1e | uVar11 << 0x22) + *plVar1 + lVar9;
      lVar9 = lVar9 + seed1;
    } while ((long *)s != plVar8);
    uVar23 = seed1 >> 0x1c | seed1 << 0x24;
    uVar10 = seed0 >> 0x14 | seed0 << 0x2c;
    lVar21 = lVar22 * 9 + lVar14;
    uVar16 = lVar14 + lVar21;
    lVar14 = *(long *)((long)plVar8 + (uVar7 - 0x37));
    lVar22 = *(long *)((long)plVar8 + (uVar7 - 0x17));
    lVar24 = uVar23 * lVar6 + *(long *)((long)plVar8 + (uVar7 - 0x3f));
    uVar18 = (uVar10 - lVar17) + lVar14 + uVar16;
    uVar11 = *(ulong *)((long)plVar8 + (uVar7 - 0xf));
    uVar18 = uVar15 * 9 ^ (uVar18 >> 0x25 | uVar18 * 0x8000000) * lVar6;
    uVar16 = uVar23 ^ uVar11 ^ uVar16;
    local_58 = local_58 + lVar9 + uVar7;
    uVar23 = local_58 >> 0x21 | local_58 * 0x80000000;
    lVar17 = *(long *)((long)plVar8 + (uVar7 - 0x2f));
    lVar13 = uVar23 * lVar6;
    uVar10 = uVar10 + lVar22 + (uVar16 >> 0x2a | uVar16 << 0x16) * lVar6;
    lVar12 = uVar15 + lVar13 + *(long *)((long)plVar8 + (uVar7 - 0x1f));
    lVar4 = *(long *)((long)plVar8 + (uVar7 - 7));
    lVar19 = *(long *)((long)plVar8 + (uVar7 - 0x27)) + uVar18;
    uVar20 = lVar14 + lVar17 + lVar24;
    uVar7 = lVar9 + uVar7 + lVar24 + lVar19;
    uVar15 = lVar22 + uVar11 + lVar12;
    uVar16 = lVar17 + uVar10 + lVar4 + lVar12;
    lVar9 = -0x651e95c4d06fbfb1;
    uVar11 = uVar15 + lVar4 ^ uVar10;
    uVar15 = lVar12 + lVar13 + (uVar15 >> 0x2c | uVar15 * 0x100000) +
             (uVar16 >> 0x15 | uVar16 << 0x2b);
    uVar16 = (uVar20 + lVar19 ^ uVar11) * lVar6;
    uVar7 = ((uVar20 >> 0x2c | uVar20 * 0x100000) + lVar24 + uVar10 +
             (uVar7 >> 0x15 | uVar7 << 0x2b) ^ uVar15) * -0x651e95c4d06fbfb1;
    uVar11 = (uVar16 >> 0x2f ^ uVar11 ^ uVar16) * lVar6;
    uVar7 = uVar7 >> 0x2f ^ uVar15 ^ uVar7;
    uVar18 = (uVar7 * -0x41befec400000000 | uVar7 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar18;
    uVar7 = (((uVar11 >> 0x2f ^ uVar11) + uVar23) * lVar6 - lVar21 ^ uVar18) * -0x651e95c4d06fbfb1;
    uVar7 = uVar7 >> 0x2f ^ uVar18 ^ uVar7;
    uVar7 = uVar7 * 0x5f20809e00000000 | uVar7 * -0x651e95c4d06fbfb1 >> 0x1f;
  }
  return uVar7 * lVar9;
}

Assistant:

uint64_t farmhash64_uo_with_seeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhash64_na_with_seeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = smix(y * k2) * k2;
  uint128_c_t v = make_uint128_c_t(seed0, seed1);
  uint128_c_t w = make_uint128_c_t(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = fetch64(s);
    uint64_t a1 = fetch64(s + 8);
    uint64_t a2 = fetch64(s + 16);
    uint64_t a3 = fetch64(s + 24);
    uint64_t a4 = fetch64(s + 32);
    uint64_t a5 = fetch64(s + 40);
    uint64_t a6 = fetch64(s + 48);
    uint64_t a7 = fetch64(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.a += a4;
    v.b += a5 + a1;
    w.a += a6;
    w.b += a7;

    x = ror64(x, 26);
    x *= 9;
    y = ror64(y, 29);
    z *= mul;
    v.a = ror64(v.a, 33);
    v.b = ror64(v.b, 30);
    w.a ^= x;
    w.a *= 9;
    z = ror64(z, 32);
    z += w.b;
    w.b += z;
    z *= 9;
    swap64(&u, &y);

    z += a0 + a6;
    v.a += a2;
    v.b += a3;
    w.a += a4;
    w.b += a5 + a6;
    x += a1;
    y += a7;

    y += v.a;
    v.a += x - y;
    v.b += w.a;
    w.a += v.b;
    w.b += x - y;
    x += w.b;
    w.b = ror64(w.b, 34);
    swap64(&u, &z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.b = ror64(v.b, 28);
  v.a = ror64(v.a, 20);
  w.a += ((len - 1) & 63);
  u += y;
  y += u;
  x = ror64(y - x + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y ^ v.b ^ fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  return farmhash_uo_h(farmhash_len_16_mul(v.a + x, w.a ^ y, mul) + z - u,
           farmhash_uo_h(v.b + y, w.b + z, k2, 30) ^ x,
           k2,
           31);
}